

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_1::readIntegerTextureViaFBOAndVerify
               (RenderContext *renderCtx,CallLogWrapper *glLog,deUint32 textureGL,
               TextureType textureType,TextureFormat *textureFormat,IVec3 *textureSize,
               ImageLayerVerifier *verifyLayer)

{
  ulong uVar1;
  deUint32 dVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  TestError *this;
  ulong uVar7;
  ulong uVar8;
  int x;
  TextureType TVar9;
  int iVar10;
  int y;
  allocator_type local_d9;
  TextureType local_d8;
  uint local_d4;
  deUint32 local_d0;
  TextureType local_cc;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  ConstPixelBufferAccess local_b0;
  TestLog *local_88;
  ScopedLogSection section;
  TextureLevel resultSlice;
  Framebuffer fbo;
  
  local_88 = glLog->m_log;
  local_d8 = textureType;
  local_d0 = textureGL;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resultSlice,"Verification",(allocator<char> *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "Result verification (bind texture layer-by-layer to FBO, read with glReadPixels())",
             (allocator<char> *)&fbo);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,local_88,(string *)&resultSlice,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&resultSlice);
  if (local_d8 == TEXTURETYPE_CUBE) {
    local_d4 = 6;
  }
  else {
    local_d4 = textureSize->m_data[2];
  }
  dVar2 = getGLTextureTarget(local_d8);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,renderCtx);
  tcu::TextureLevel::TextureLevel
            (&resultSlice,textureFormat,textureSize->m_data[0],textureSize->m_data[1],1);
  glu::CallLogWrapper::glBindFramebuffer(glLog,0x8d40,fbo.super_ObjectWrapper.m_object);
  TVar9 = local_d8;
  iVar3 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  dVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(dVar4,"Bind FBO",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x34b);
  glu::CallLogWrapper::glMemoryBarrier(glLog,0x400);
  iVar3 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  dVar4 = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
  glu::checkError(dVar4,"glMemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x34e);
  glu::CallLogWrapper::glActiveTexture(glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(glLog,dVar2,local_d0);
  setTexParameteri(glLog,dVar2);
  local_cc = TVar9 & ~TEXTURETYPE_CUBE;
  uVar8 = 0;
  if (0 < (int)local_d4) {
    uVar8 = (ulong)local_d4;
  }
  uVar1 = 0;
  do {
    uVar7 = uVar1;
    if (uVar7 == uVar8) break;
    if (TVar9 == TEXTURETYPE_CUBE) {
      dVar2 = cubeFaceToGLFace((&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::
                                 faces)[uVar7]);
LAB_0124da92:
      glu::CallLogWrapper::glFramebufferTexture2D(glLog,0x8d40,0x8ce0,dVar2,local_d0,0);
    }
    else {
      if (TVar9 == TEXTURETYPE_2D) {
        dVar2 = 0xde1;
        goto LAB_0124da92;
      }
      if (local_cc == TEXTURETYPE_2D_ARRAY) {
        glu::CallLogWrapper::glFramebufferTextureLayer(glLog,0x8d40,0x8ce0,local_d0,0,(GLint)uVar7);
      }
    }
    iVar3 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
    dVar2 = (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x800))();
    glu::checkError(dVar2,"Bind texture to framebuffer color attachment 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x35f);
    GVar5 = glu::CallLogWrapper::glCheckFramebufferStatus(glLog,0x8d40);
    if (GVar5 != 0x8cd5) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,(char *)0x0,
                 "glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                 ,0x361);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_b0,&resultSlice);
    if (((ulong)local_b0.m_format.type < 0x22) &&
       ((0x2c0000000U >> ((ulong)local_b0.m_format.type & 0x3f) & 1) != 0)) {
      std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      vector(&data,(long)(local_b0.m_size.m_data[1] * local_b0.m_size.m_data[0]),&local_d9);
      glu::CallLogWrapper::glReadPixels
                (glLog,0,0,local_b0.m_size.m_data[0],local_b0.m_size.m_data[1],0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      for (iVar3 = 0; iVar3 < local_b0.m_size.m_data[1]; iVar3 = iVar3 + 1) {
        for (iVar10 = 0; iVar10 < local_b0.m_size.m_data[0]; iVar10 = iVar10 + 1) {
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_b0,
                     data.
                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (local_b0.m_size.m_data[0] * iVar3 + iVar10),iVar10,iVar3,0);
        }
      }
      std::
      _Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                   );
      TVar9 = local_d8;
    }
    else if (local_b0.m_format.type - SIGNED_INT8 < 3) {
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
                ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data,
                 (long)(local_b0.m_size.m_data[1] * local_b0.m_size.m_data[0]),
                 (allocator_type *)&local_d9);
      glu::CallLogWrapper::glReadPixels
                (glLog,0,0,local_b0.m_size.m_data[0],local_b0.m_size.m_data[1],0x8d99,0x1404,
                 data.
                 super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      for (iVar3 = 0; iVar3 < local_b0.m_size.m_data[1]; iVar3 = iVar3 + 1) {
        for (iVar10 = 0; iVar10 < local_b0.m_size.m_data[0]; iVar10 = iVar10 + 1) {
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_b0,
                     (IVec4 *)(data.
                               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                              (local_b0.m_size.m_data[0] * iVar3 + iVar10)),iVar10,iVar3,0);
        }
      }
      std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
                ((_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data);
      TVar9 = local_d8;
    }
    iVar3 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
    dVar2 = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
    glu::checkError(dVar2,"glReadPixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x364);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_b0,&resultSlice);
    iVar3 = (**verifyLayer->_vptr_ImageLayerVerifier)
                      (verifyLayer,local_88,&local_b0,uVar7 & 0xffffffff);
    uVar1 = uVar7 + 1;
  } while ((char)iVar3 != '\0');
  lVar6 = (long)(int)local_d4;
  tcu::TextureLevel::~TextureLevel(&resultSlice);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return lVar6 <= (long)uVar7;
}

Assistant:

static bool readIntegerTextureViaFBOAndVerify (const RenderContext&			renderCtx,
											   glu::CallLogWrapper&			glLog,
											   deUint32						textureGL,
											   TextureType					textureType,
											   const TextureFormat&			textureFormat,
											   const IVec3&					textureSize,
											   const ImageLayerVerifier&	verifyLayer)
{
	DE_ASSERT(isFormatTypeInteger(textureFormat.type));
	DE_ASSERT(textureType != TEXTURETYPE_BUFFER);

	TestLog& log = glLog.getLog();

	const tcu::ScopedLogSection section(log, "Verification", "Result verification (bind texture layer-by-layer to FBO, read with glReadPixels())");

	const int			numSlicesOrFaces	= textureType == TEXTURETYPE_CUBE ? 6 : textureSize.z();
	const deUint32		textureTargetGL		= getGLTextureTarget(textureType);
	glu::Framebuffer	fbo					(renderCtx);
	tcu::TextureLevel	resultSlice			(textureFormat, textureSize.x(), textureSize.y());

	glLog.glBindFramebuffer(GL_FRAMEBUFFER, *fbo);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Bind FBO");

	glLog.glMemoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glMemoryBarrier");

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, textureGL);
	setTexParameteri(glLog, textureTargetGL);

	for (int sliceOrFaceNdx = 0; sliceOrFaceNdx < numSlicesOrFaces; sliceOrFaceNdx++)
	{
		if (textureType == TEXTURETYPE_CUBE)
			glLog.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx)), textureGL, 0);
		else if (textureType == TEXTURETYPE_2D)
			glLog.glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureGL, 0);
		else if (textureType == TEXTURETYPE_3D || textureType == TEXTURETYPE_2D_ARRAY)
			glLog.glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureGL, 0, sliceOrFaceNdx);
		else
			DE_ASSERT(false);

		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Bind texture to framebuffer color attachment 0");

		TCU_CHECK(glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

		readPixelsRGBAInteger32(resultSlice.getAccess(), 0, 0, glLog);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glReadPixels");

		if (!verifyLayer(log, resultSlice, sliceOrFaceNdx))
			return false;
	}

	return true;
}